

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O2

void __thiscall Assimp::Q3BSPFileParser::~Q3BSPFileParser(Q3BSPFileParser *this)

{
  Q3BSPModel *this_00;
  
  this_00 = this->m_pModel;
  if (this_00 != (Q3BSPModel *)0x0) {
    Q3BSP::Q3BSPModel::~Q3BSPModel(this_00);
  }
  operator_delete(this_00,0xe0);
  this->m_pModel = (Q3BSPModel *)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_Data).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

Q3BSPFileParser::~Q3BSPFileParser() {
    delete m_pModel;
    m_pModel = nullptr;
}